

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_lee_2021_brts.h
# Opt level: O0

double __thiscall BRTS<TTA>::Get_RunAllocTime(BRTS<TTA> *this)

{
  Run *pRVar1;
  double dVar2;
  double dVar3;
  double t_result;
  double t;
  Runs runs_temp;
  size_t size_used;
  size_t i;
  Run *run_end;
  Run *run_start;
  BRTS<TTA> *this_local;
  
  pRVar1 = (this->data_runs).runs;
  i = (size_t)pRVar1;
  for (size_used = 0; size_used < (this->data_runs).height; size_used = size_used + 1) {
    for (; *(short *)i != -1; i = i + 8) {
    }
    i = i + 8;
  }
  runs_temp._8_8_ = i - (long)pRVar1;
  PerformanceEvaluator::start
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  Runs::Alloc((Runs *)&t,(this->data_runs).height,(this->data_runs).width);
  memset((void *)t,0,runs_temp._8_8_);
  PerformanceEvaluator::stop
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  dVar2 = PerformanceEvaluator::last
                    (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  PerformanceEvaluator::start
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  memset((void *)t,0,runs_temp._8_8_);
  PerformanceEvaluator::stop
            (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  dVar3 = PerformanceEvaluator::last
                    (&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.perf_);
  Runs::Dealloc((Runs *)&t);
  return dVar2 - dVar3;
}

Assistant:

double Get_RunAllocTime() {
        Run* run_start = data_runs.runs;
        Run* run_end = run_start;
        for (size_t i = 0; i < data_runs.height; i++, run_end++) {
            for (; run_end->start_pos != 0xFFFF; run_end++);
        }
        size_t size_used = (size_t)run_end - (size_t)run_start;

        Runs runs_temp;
        perf_.start();
        runs_temp.Alloc(data_runs.height, data_runs.width);
        memset(runs_temp.runs, 0, size_used);
        perf_.stop();
        double t = perf_.last();

        perf_.start();
        memset(runs_temp.runs, 0, size_used);
        perf_.stop();
        double t_result = t - perf_.last();

        runs_temp.Dealloc();
        return t_result;
    }